

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::Compute(cmGlobalGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  cmMakefile *pcVar3;
  pointer puVar4;
  __uniq_ptr_data<cmInstallGenerator,_std::default_delete<cmInstallGenerator>,_true,_true> _Var5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  pointer puVar10;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  pointer puVar11;
  string local_58;
  pointer local_38;
  
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_DEFAULT_BUILD_TYPE","")
  ;
  iVar9 = (*this->_vptr_cmGlobalGenerator[0x34])(this);
  bVar6 = UnsupportedVariableIsDefined(this,&local_58,SUB41(iVar9,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (!bVar6) {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_CROSS_CONFIGS","");
    iVar9 = (*this->_vptr_cmGlobalGenerator[0x35])(this);
    bVar6 = UnsupportedVariableIsDefined(this,&local_58,SUB41(iVar9,0));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (!bVar6) {
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"CMAKE_DEFAULT_CONFIGS","");
      iVar9 = (*this->_vptr_cmGlobalGenerator[0x36])(this);
      bVar6 = UnsupportedVariableIsDefined(this,&local_58,SUB41(iVar9,0));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((!bVar6) && (iVar9 = (*this->_vptr_cmGlobalGenerator[0xd])(this), (char)iVar9 != '\0')) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(&this->FilesReplacedDuringGenerate,
                          (this->FilesReplacedDuringGenerate).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&(this->CMP0042WarnTargets)._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&(this->CMP0068WarnTargets)._M_t);
        iVar9 = (*this->_vptr_cmGlobalGenerator[0x3c])(this);
        if ((char)iVar9 != '\0') {
          FinalizeTargetConfiguration(this);
          CreateGenerationObjects(this,AllTargets);
          FillProjectMap(this);
          AddAutomaticSources(this);
          bVar6 = AddHeaderSetVerification(this);
          if (!bVar6) {
            return false;
          }
          bVar6 = QtAutoGen(this);
          if (bVar6) {
            puVar2 = (this->LocalGenerators).
                     super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar11 = (this->LocalGenerators).
                           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2;
                puVar11 = puVar11 + 1) {
              (*((puVar11->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->
                _vptr_cmLocalGenerator[4])();
            }
            puVar11 = (this->LocalGenerators).
                      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (this->LocalGenerators).
                     super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            bVar6 = puVar11 == puVar2;
            if (!bVar6) {
              bVar7 = cmLocalGenerator::ComputeTargetCompileFeatures
                                ((puVar11->_M_t).
                                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                                 .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
              if (bVar7) {
                do {
                  puVar11 = puVar11 + 1;
                  bVar6 = puVar11 == puVar2;
                  if (bVar6) goto LAB_00414768;
                  bVar7 = cmLocalGenerator::ComputeTargetCompileFeatures
                                    ((puVar11->_M_t).
                                     super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                                     .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)
                  ;
                } while (bVar7);
              }
              if (!bVar6) {
                return false;
              }
            }
LAB_00414768:
            puVar11 = (this->LocalGenerators).
                      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_38 = (this->LocalGenerators).
                       super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            bVar6 = puVar11 == local_38;
            while (!bVar6) {
              pcVar3 = ((puVar11->_M_t).
                        super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                        .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
              puVar10 = *(pointer *)
                         &(pcVar3->InstallGenerators).
                          super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                          ._M_impl;
              puVar4 = (pcVar3->InstallGenerators).
                       super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              bVar7 = puVar10 == puVar4;
              if (!bVar7) {
                _Var5.
                super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl =
                     (puVar10->_M_t).
                     super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                ;
                cVar8 = (**(code **)(*(long *)_Var5.
                                              super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                                              .super__Head_base<0UL,_cmInstallGenerator_*,_false>.
                                              _M_head_impl + 0x50))
                                  (_Var5.
                                   super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                                   .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl,
                                   (puVar11->_M_t).
                                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                                   .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
                while (cVar8 != '\0') {
                  puVar10 = puVar10 + 1;
                  bVar7 = puVar10 == puVar4;
                  if (bVar7) goto LAB_004147da;
                  _Var5.
                  super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                  .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl =
                       (puVar10->_M_t).
                       super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                  ;
                  cVar8 = (**(code **)(*(long *)_Var5.
                                                super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                                                .super__Head_base<0UL,_cmInstallGenerator_*,_false>.
                                                _M_head_impl + 0x50))
                                    (_Var5.
                                     super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                                     .super__Head_base<0UL,_cmInstallGenerator_*,_false>.
                                     _M_head_impl,
                                     (puVar11->_M_t).
                                     super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                                     .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)
                  ;
                }
                if (!bVar7) {
                  if (!bVar6) {
                    return false;
                  }
                  break;
                }
              }
LAB_004147da:
              puVar11 = puVar11 + 1;
              bVar6 = puVar11 == local_38;
            }
            (*this->_vptr_cmGlobalGenerator[0xe])(this);
            puVar2 = (this->LocalGenerators).
                     super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar11 = (this->LocalGenerators).
                           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2;
                puVar11 = puVar11 + 1) {
              cmLocalGenerator::TraceDependencies
                        ((puVar11->_M_t).
                         super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                         .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
            }
            bVar6 = CheckTargetsForMissingSources(this);
            if (!bVar6) {
              (*this->_vptr_cmGlobalGenerator[0x3e])(this);
              puVar2 = (this->LocalGenerators).
                       super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (puVar11 = (this->LocalGenerators).
                             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2;
                  puVar11 = puVar11 + 1) {
                cmLocalGenerator::ComputeTargetManifest
                          ((puVar11->_M_t).
                           super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                           .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
              }
              iVar9 = (*this->_vptr_cmGlobalGenerator[0x3b])(this);
              if ((char)iVar9 != '\0') {
                ComputeTargetOrder(this);
                bVar6 = CheckTargetsForType(this);
                if ((!bVar6) && (bVar6 = CheckTargetsForPchCompilePdb(this), !bVar6)) {
                  puVar2 = (this->LocalGenerators).
                           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (puVar11 = (this->LocalGenerators).
                                 super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2;
                      puVar11 = puVar11 + 1) {
                    (*((puVar11->_M_t).
                       super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                       .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->
                      _vptr_cmLocalGenerator[3])();
                  }
                  return true;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool cmGlobalGenerator::Compute()
{
  // Make sure unsupported variables are not used.
  if (this->UnsupportedVariableIsDefined("CMAKE_DEFAULT_BUILD_TYPE",
                                         this->SupportsDefaultBuildType())) {
    return false;
  }
  if (this->UnsupportedVariableIsDefined("CMAKE_CROSS_CONFIGS",
                                         this->SupportsCrossConfigs())) {
    return false;
  }
  if (this->UnsupportedVariableIsDefined("CMAKE_DEFAULT_CONFIGS",
                                         this->SupportsDefaultConfigs())) {
    return false;
  }
  if (!this->InspectConfigTypeVariables()) {
    return false;
  }

  // Some generators track files replaced during the Generate.
  // Start with an empty vector:
  this->FilesReplacedDuringGenerate.clear();

  // clear targets to issue warning CMP0042 for
  this->CMP0042WarnTargets.clear();
  // clear targets to issue warning CMP0068 for
  this->CMP0068WarnTargets.clear();

  // Check whether this generator is allowed to run.
  if (!this->CheckALLOW_DUPLICATE_CUSTOM_TARGETS()) {
    return false;
  }
  this->FinalizeTargetConfiguration();

  this->CreateGenerationObjects();

  // at this point this->LocalGenerators has been filled,
  // so create the map from project name to vector of local generators
  this->FillProjectMap();

  // Add automatically generated sources (e.g. unity build).
  if (!this->AddAutomaticSources()) {
    return false;
  }

  // Iterate through all targets and add verification targets for header sets
  if (!this->AddHeaderSetVerification()) {
    return false;
  }

  // Iterate through all targets and set up AUTOMOC, AUTOUIC and AUTORCC
  if (!this->QtAutoGen()) {
    return false;
  }

  // Add generator specific helper commands
  for (const auto& localGen : this->LocalGenerators) {
    localGen->AddHelperCommands();
  }

  // Perform up-front computation in order to handle errors (such as unknown
  // features) at this point. While processing the compile features we also
  // calculate and cache the language standard required by the compile
  // features.
  for (const auto& localGen : this->LocalGenerators) {
    if (!localGen->ComputeTargetCompileFeatures()) {
      return false;
    }
  }

  for (const auto& localGen : this->LocalGenerators) {
    cmMakefile* mf = localGen->GetMakefile();
    for (const auto& g : mf->GetInstallGenerators()) {
      if (!g->Compute(localGen.get())) {
        return false;
      }
    }
  }

  this->AddExtraIDETargets();

  // Trace the dependencies, after that no custom commands should be added
  // because their dependencies might not be handled correctly
  for (const auto& localGen : this->LocalGenerators) {
    localGen->TraceDependencies();
  }

  // Make sure that all (non-imported) targets have source files added!
  if (this->CheckTargetsForMissingSources()) {
    return false;
  }

  this->ForceLinkerLanguages();

  // Compute the manifest of main targets generated.
  for (const auto& localGen : this->LocalGenerators) {
    localGen->ComputeTargetManifest();
  }

  // Compute the inter-target dependencies.
  if (!this->ComputeTargetDepends()) {
    return false;
  }
  this->ComputeTargetOrder();

  if (this->CheckTargetsForType()) {
    return false;
  }

  if (this->CheckTargetsForPchCompilePdb()) {
    return false;
  }

  for (const auto& localGen : this->LocalGenerators) {
    localGen->ComputeHomeRelativeOutputPath();
  }

  return true;
}